

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,bool *variable,string *value)

{
  bool bVar1;
  string *value_local;
  bool *variable_local;
  CommandLineArguments *this_local;
  
  bVar1 = std::operator==(value,"1");
  if ((((((!bVar1) && (bVar1 = std::operator==(value,"ON"), !bVar1)) &&
        (bVar1 = std::operator==(value,"on"), !bVar1)) &&
       ((bVar1 = std::operator==(value,"On"), !bVar1 &&
        (bVar1 = std::operator==(value,"TRUE"), !bVar1)))) &&
      ((bVar1 = std::operator==(value,"true"), !bVar1 &&
       ((bVar1 = std::operator==(value,"True"), !bVar1 &&
        (bVar1 = std::operator==(value,"yes"), !bVar1)))))) &&
     ((bVar1 = std::operator==(value,"Yes"), !bVar1 &&
      (bVar1 = std::operator==(value,"YES"), !bVar1)))) {
    *variable = false;
    return;
  }
  *variable = true;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  bool* variable, const std::string& value)
{
  if ( value == "1" || value == "ON" || value == "on" || value == "On" ||
    value == "TRUE" || value == "true" || value == "True" ||
    value == "yes" || value == "Yes" || value == "YES" )
    {
    *variable = true;
    }
  else
    {
    *variable = false;
    }
}